

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Write(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Gia_Man_t *pInit;
  char *pcVar6;
  Gia_Man_t *pGia;
  int fVerbose;
  int fWriteNewLine;
  int fMiniLut;
  int fMiniAig;
  int fVerilog;
  int fUnique;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  pGia._4_4_ = 0;
  pGia._0_4_ = 0;
  Extra_UtilGetoptReset();
LAB_0029e304:
  iVar5 = Extra_UtilGetopt(argc,argv,"upmlnvh");
  if (iVar5 == -1) {
    if (argc - globalUtilOptind == 1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Write(): There is no AIG to write.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pcVar6 = argv[globalUtilOptind];
        if (bVar1) {
          pInit = Gia_ManIsoCanonicize(pAbc->pGia,(uint)pGia);
          Gia_AigerWriteSimple(pInit,pcVar6);
          Gia_ManStop(pInit);
        }
        else if (bVar2) {
          Gia_ManDumpVerilog(pAbc->pGia,pcVar6,(Vec_Int_t *)0x0);
        }
        else if (bVar3) {
          Gia_ManWriteMiniAig(pAbc->pGia,pcVar6);
        }
        else if (bVar4) {
          Gia_ManWriteMiniLut(pAbc->pGia,pcVar6);
        }
        else {
          Gia_AigerWrite(pAbc->pGia,pcVar6,0,0,pGia._4_4_);
        }
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(-1,"There is no file name.\n");
      pAbc_local._4_4_ = 1;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar5) {
  case 0x68:
    break;
  default:
    break;
  case 0x6c:
    bVar4 = (bool)(bVar4 ^ 1);
    goto LAB_0029e304;
  case 0x6d:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_0029e304;
  case 0x6e:
    pGia._4_4_ = pGia._4_4_ ^ 1;
    goto LAB_0029e304;
  case 0x70:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0029e304;
  case 0x75:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0029e304;
  case 0x76:
    goto switchD_0029e342_caseD_76;
  }
  Abc_Print(-2,"usage: &w [-upmlnvh] <file>\n");
  Abc_Print(-2,"\t         writes the current AIG into the AIGER file\n");
  pcVar6 = "no";
  if (bVar1) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",pcVar6);
  pcVar6 = "no";
  if (bVar2) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-p     : toggle writing Verilog with \'and\' and \'not\' [default = %s]\n",pcVar6)
  ;
  pcVar6 = "no";
  if (bVar3) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n",pcVar6);
  pcVar6 = "no";
  if (bVar4) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-l     : toggle writing MiniLUT rather than AIGER [default = %s]\n",pcVar6);
  pcVar6 = "no";
  if (pGia._4_4_ != 0) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-n     : toggle writing \'\\n\' after \'c\' in the AIGER file [default = %s]\n",
            pcVar6);
  pcVar6 = "no";
  if ((uint)pGia != 0) {
    pcVar6 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
switchD_0029e342_caseD_76:
  pGia._0_4_ = (uint)pGia ^ 1;
  goto LAB_0029e304;
}

Assistant:

int Abc_CommandAbc9Write( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fUnique = 0;
    int fVerilog = 0;
    int fMiniAig = 0;
    int fMiniLut = 0;
    int fWriteNewLine = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "upmlnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'u':
            fUnique ^= 1;
            break;
        case 'p':
            fVerilog ^= 1;
            break;
        case 'm':
            fMiniAig ^= 1;
            break;
        case 'l':
            fMiniLut ^= 1;
            break;
        case 'n':
            fWriteNewLine ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Write(): There is no AIG to write.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( fUnique )
    {
        Gia_Man_t * pGia = Gia_ManIsoCanonicize( pAbc->pGia, fVerbose );
        Gia_AigerWriteSimple( pGia, pFileName );
        Gia_ManStop( pGia );
    }
    else if ( fVerilog )
        Gia_ManDumpVerilog( pAbc->pGia, pFileName, NULL );
    else if ( fMiniAig )
        Gia_ManWriteMiniAig( pAbc->pGia, pFileName );
    else if ( fMiniLut )
        Gia_ManWriteMiniLut( pAbc->pGia, pFileName );
    else
        Gia_AigerWrite( pAbc->pGia, pFileName, 0, 0, fWriteNewLine );
    return 0;

usage:
    Abc_Print( -2, "usage: &w [-upmlnvh] <file>\n" );
    Abc_Print( -2, "\t         writes the current AIG into the AIGER file\n" );
    Abc_Print( -2, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    Abc_Print( -2, "\t-p     : toggle writing Verilog with 'and' and 'not' [default = %s]\n", fVerilog? "yes" : "no" );
    Abc_Print( -2, "\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n", fMiniAig? "yes" : "no" );
    Abc_Print( -2, "\t-l     : toggle writing MiniLUT rather than AIGER [default = %s]\n", fMiniLut? "yes" : "no" );
    Abc_Print( -2, "\t-n     : toggle writing \'\\n\' after \'c\' in the AIGER file [default = %s]\n", fWriteNewLine? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}